

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1c5214::fillPixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  half *phVar1;
  int in_ECX;
  Array2D<Imath_3_2::half> *in_RDX;
  int *in_RSI;
  int *in_RDI;
  undefined1 in_R8B;
  half rgbaValue [4];
  int j;
  int i;
  undefined1 local_30 [7];
  undefined1 in_stack_ffffffffffffffd7;
  int iVar2;
  int iVar3;
  undefined3 in_stack_ffffffffffffffe0;
  uint j_00;
  
  j_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  for (iVar3 = 0; iVar3 < *in_RDI; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
      generatePixel(in_ECX,j_00,(half *)CONCAT44(iVar3,iVar2),(bool)in_stack_ffffffffffffffd7);
      phVar1 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](in_RDX,(long)iVar3);
      memcpy(phVar1 + iVar2 * in_ECX,local_30,(long)in_ECX << 1);
    }
  }
  return;
}

Assistant:

void
fillPixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            half rgbaValue[4];

            generatePixel (i, j, &rgbaValue[0], pIsLeft);
            memcpy (
                (void*) &pPixels[i][j * pNbChannels],
                &rgbaValue[0],
                pNbChannels * sizeof (half));
        }
    }
}